

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O0

loader_manager_impl loader_manager_impl_initialize(void)

{
  loader_manager_impl __ptr;
  vector pvVar1;
  set psVar2;
  uint64_t uVar3;
  plugin ppVar4;
  vector unaff_retaddr;
  loader_manager_impl manager_impl;
  
  __ptr = (loader_manager_impl)malloc(0x28);
  if (__ptr == (loader_manager_impl)0x0) {
    log_write_impl_va("metacall",0x86,"loader_manager_impl_initialize",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                      ,3,"Loader failed to allocate its implementation");
  }
  else {
    pvVar1 = (vector)vector_create(0x18);
    __ptr->initialization_order = pvVar1;
    if (__ptr->initialization_order == (vector)0x0) {
      log_write_impl_va("metacall",0x8e,"loader_manager_impl_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                        ,3,"Loader failed to allocate the initialization order vector");
    }
    else {
      psVar2 = (set)set_create(hash_callback_ptr,comparable_callback_ptr);
      __ptr->destroy_map = psVar2;
      if (__ptr->destroy_map == (set)0x0) {
        log_write_impl_va("metacall",0x96,"loader_manager_impl_initialize",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                          ,3,"Loader failed to allocate the destroy map");
      }
      else {
        pvVar1 = loader_manager_impl_script_paths_initialize();
        __ptr->script_paths = pvVar1;
        if (__ptr->script_paths == (vector)0x0) {
          log_write_impl_va("metacall",0x9e,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,3,"Loader failed to initialize the script paths");
        }
        else {
          uVar3 = thread_id_get_current();
          __ptr->init_thread_id = uVar3;
          ppVar4 = loader_host_initialize();
          __ptr->host = ppVar4;
          if (__ptr->host != (plugin)0x0) {
            return __ptr;
          }
          log_write_impl_va("metacall",0xa8,"loader_manager_impl_initialize",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_manager_impl.c"
                            ,3,"Loader failed to initialize the host loader");
          loader_manager_impl_script_paths_destroy(unaff_retaddr);
        }
        set_destroy(__ptr->destroy_map);
      }
      vector_destroy(__ptr->initialization_order);
    }
    free(__ptr);
  }
  return (loader_manager_impl)0x0;
}

Assistant:

loader_manager_impl loader_manager_impl_initialize(void)
{
	loader_manager_impl manager_impl = malloc(sizeof(struct loader_manager_impl_type));

	if (manager_impl == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate its implementation");
		goto alloc_error;
	}

	manager_impl->initialization_order = vector_create(sizeof(struct loader_initialization_order_type));

	if (manager_impl->initialization_order == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the initialization order vector");
		goto initialization_order_error;
	}

	manager_impl->destroy_map = set_create(&hash_callback_ptr, &comparable_callback_ptr);

	if (manager_impl->destroy_map == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to allocate the destroy map");
		goto destroy_map_error;
	}

	manager_impl->script_paths = loader_manager_impl_script_paths_initialize();

	if (manager_impl->script_paths == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the script paths");
		goto script_paths_error;
	}

	manager_impl->init_thread_id = thread_id_get_current();

	manager_impl->host = loader_host_initialize();

	if (manager_impl->host == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Loader failed to initialize the host loader");
		goto host_error;
	}

	return manager_impl;

host_error:
	loader_manager_impl_script_paths_destroy(manager_impl->script_paths);
script_paths_error:
	set_destroy(manager_impl->destroy_map);
destroy_map_error:
	vector_destroy(manager_impl->initialization_order);
initialization_order_error:
	free(manager_impl);
alloc_error:
	return NULL;
}